

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O1

void __thiscall GraphTest::GraphTest(GraphTest *this)

{
  State *pSVar1;
  VirtualFileSystem *pVVar2;
  _Rb_tree_header *p_Var3;
  
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_001d6ec8;
  pVVar2 = &this->fs_;
  (this->fs_).super_DiskInterface.super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__VirtualFileSystem_001d87a0;
  p_Var3 = &(this->fs_).files_._M_t._M_impl.super__Rb_tree_header;
  (this->fs_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fs_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fs_).directories_made_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fs_).directories_made_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fs_).directories_made_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fs_).files_read_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fs_).files_read_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fs_).files_read_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fs_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->fs_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->fs_).files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->fs_).files_removed_._M_t._M_impl.super__Rb_tree_header;
  (this->fs_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fs_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->fs_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->fs_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->fs_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->fs_).files_created_._M_t._M_impl.super__Rb_tree_header;
  (this->fs_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fs_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->fs_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->fs_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->fs_).files_created_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fs_).now_ = 1;
  pSVar1 = &(this->super_StateTestWithBuiltinRules).state_;
  (this->scan_).build_log_ = (BuildLog *)0x0;
  (this->scan_).disk_interface_ = &pVVar2->super_DiskInterface;
  (this->scan_).dep_loader_.state_ = pSVar1;
  (this->scan_).dep_loader_.disk_interface_ = &pVVar2->super_DiskInterface;
  (this->scan_).dep_loader_.deps_log_ = (DepsLog *)0x0;
  (this->scan_).dep_loader_.depfile_parser_options_ = (DepfileParserOptions *)0x0;
  (this->scan_).dyndep_loader_.state_ = pSVar1;
  (this->scan_).dyndep_loader_.disk_interface_ = &pVVar2->super_DiskInterface;
  return;
}

Assistant:

GraphTest() : scan_(&state_, NULL, NULL, &fs_, NULL) {}